

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O1

CURLFORMcode curl_formadd(curl_httppost **httppost,curl_httppost **last_post,...)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  curl_slist *pcVar4;
  char *pcVar5;
  bool bVar6;
  curl_strdup_callback p_Var7;
  bool bVar8;
  char in_AL;
  int iVar9;
  long *plVar10;
  long *plVar11;
  long *plVar12;
  void **ppvVar13;
  size_t sVar14;
  size_t sVar15;
  char *pcVar16;
  void *pvVar17;
  curl_httppost *pcVar18;
  curl_httppost *pcVar19;
  uint uVar20;
  undefined8 in_RCX;
  ulong uVar21;
  curl_httppost **ppcVar22;
  undefined8 in_RDX;
  FormInfo *ptr;
  size_t sVar23;
  char *pcVar24;
  undefined8 in_R8;
  undefined8 in_R9;
  CURLFORMcode CVar25;
  long lVar26;
  int *piVar27;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  void **local_160;
  char *local_150;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_160 = &arg[0].overflow_arg_area;
  uVar20 = 0x10;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  plVar10 = (long *)(*Curl_ccalloc)(1,0x80);
  if (plVar10 == (long *)0x0) {
    return CURL_FORMADD_MEMORY;
  }
  bVar6 = false;
  pcVar16 = (char *)0x0;
  piVar27 = (int *)0x0;
  plVar11 = plVar10;
LAB_00514de5:
  CVar25 = CURL_FORMADD_OK;
switchD_00514e61_caseD_9:
  bVar8 = bVar6;
  do {
    bVar6 = bVar8;
    plVar12 = plVar10;
    if (CVar25 != CURL_FORMADD_OK) goto LAB_0051553d;
    if ((!bVar6) || (piVar27 == (int *)0x0)) {
      uVar21 = (ulong)uVar20;
      if (uVar21 < 0x29) {
        uVar20 = uVar20 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar21);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      iVar9 = *(int *)ppvVar13;
      if (iVar9 == 0x11) goto LAB_005155b1;
      break;
    }
    iVar9 = *piVar27;
    pcVar16 = *(char **)(piVar27 + 2);
    piVar27 = piVar27 + 4;
    CVar25 = CURL_FORMADD_OK;
    bVar8 = false;
  } while (iVar9 == 0x11);
  CVar25 = CURL_FORMADD_UNKNOWN_OPTION;
  pcVar24 = pcVar16;
  switch(iVar9) {
  case 1:
    goto switchD_00514e61_caseD_1;
  case 2:
    *(byte *)(plVar11 + 8) = *(byte *)(plVar11 + 8) | 4;
switchD_00514e61_caseD_1:
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if (*plVar11 == 0) {
      if (!bVar6) {
        uVar21 = (ulong)uVar20;
        if (uVar21 < 0x29) {
          uVar20 = uVar20 + 8;
          ppvVar13 = (void **)((long)local_e8 + uVar21);
        }
        else {
          ppvVar13 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar24 = (char *)*ppvVar13;
      }
      CVar25 = CURL_FORMADD_NULL;
      if (pcVar24 != (char *)0x0) {
        *plVar11 = (long)pcVar24;
        CVar25 = CURL_FORMADD_OK;
      }
    }
    goto switchD_00514e61_caseD_9;
  case 3:
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if (plVar11[2] == 0) {
      if (!bVar6) {
        uVar21 = (ulong)uVar20;
        if (uVar21 < 0x29) {
          uVar20 = uVar20 + 8;
          ppvVar13 = (void **)((long)local_e8 + uVar21);
        }
        else {
          ppvVar13 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar24 = (char *)*ppvVar13;
      }
      plVar11[2] = (long)pcVar24;
      CVar25 = CURL_FORMADD_OK;
    }
    goto switchD_00514e61_caseD_9;
  case 4:
    goto switchD_00514e61_caseD_4;
  case 5:
    *(byte *)(plVar11 + 8) = *(byte *)(plVar11 + 8) | 8;
switchD_00514e61_caseD_4:
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if (plVar11[3] != 0) goto switchD_00514e61_caseD_9;
    if (!bVar6) {
      uVar21 = (ulong)uVar20;
      if (uVar21 < 0x29) {
        uVar20 = uVar20 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar21);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar24 = (char *)*ppvVar13;
    }
    CVar25 = CURL_FORMADD_NULL;
    if (pcVar24 == (char *)0x0) goto switchD_00514e61_caseD_9;
    break;
  case 6:
    goto switchD_00514e61_caseD_6;
  case 7:
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if ((*(byte *)(plVar11 + 8) & 10) == 0) {
      if (!bVar6) {
        uVar21 = (ulong)uVar20;
        if (uVar21 < 0x29) {
          uVar20 = uVar20 + 8;
          ppvVar13 = (void **)((long)local_e8 + uVar21);
        }
        else {
          ppvVar13 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar24 = (char *)*ppvVar13;
      }
      CVar25 = CURL_FORMADD_NULL;
      if (pcVar24 != (char *)0x0) {
        pcVar24 = (*Curl_cstrdup)(pcVar24);
        plVar11[3] = (long)pcVar24;
        CVar25 = CURL_FORMADD_MEMORY;
        if (pcVar24 != (char *)0x0) {
          *(byte *)(plVar11 + 8) = *(byte *)(plVar11 + 8) | 2;
          goto LAB_005154db;
        }
      }
    }
    goto switchD_00514e61_caseD_9;
  case 8:
    CVar25 = CURL_FORMADD_ILLEGAL_ARRAY;
    if (!bVar6) {
      uVar21 = (ulong)uVar20;
      if (uVar21 < 0x29) {
        uVar20 = uVar20 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar21);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      piVar27 = (int *)*ppvVar13;
      bVar6 = piVar27 != (int *)0x0;
      CVar25 = (uint)(piVar27 == (int *)0x0) * 3;
    }
  default:
    goto switchD_00514e61_caseD_9;
  case 10:
    if (!bVar6) {
      uVar21 = (ulong)uVar20;
      if (uVar21 < 0x29) {
        uVar20 = uVar20 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar21);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar24 = (char *)*ppvVar13;
    }
    if (plVar11[3] == 0) {
      CVar25 = CURL_FORMADD_NULL;
      if (pcVar24 != (char *)0x0) {
        pcVar24 = (*Curl_cstrdup)(pcVar24);
        plVar11[3] = (long)pcVar24;
        CVar25 = CURL_FORMADD_MEMORY;
        if (pcVar24 != (char *)0x0) {
          *(byte *)(plVar11 + 8) = *(byte *)(plVar11 + 8) | 1;
LAB_005154db:
          *(undefined1 *)(plVar11 + 4) = 1;
          CVar25 = CURL_FORMADD_OK;
        }
      }
      goto switchD_00514e61_caseD_9;
    }
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if (((*(byte *)(plVar11 + 8) & 1) == 0) || (CVar25 = CURL_FORMADD_NULL, pcVar24 == (char *)0x0))
    goto switchD_00514e61_caseD_9;
    local_150 = (*Curl_cstrdup)(pcVar24);
    CVar25 = CURL_FORMADD_MEMORY;
    if (local_150 == (char *)0x0) goto switchD_00514e61_caseD_9;
    plVar12 = (long *)(*Curl_ccalloc)(1,0x80);
    if (plVar12 == (long *)0x0) {
      plVar12 = (long *)0x0;
    }
    else {
      plVar12[3] = (long)local_150;
      plVar12[8] = 1;
      plVar12[0xf] = plVar11[0xf];
      plVar11[0xf] = (long)plVar12;
    }
    if (plVar12 == (long *)0x0) goto LAB_0051550c;
    *(undefined1 *)(plVar12 + 4) = 1;
    plVar11 = plVar12;
    goto LAB_00514de5;
  case 0xb:
  case 0x10:
    if (!bVar6) {
      uVar21 = (ulong)uVar20;
      if (uVar21 < 0x29) {
        uVar20 = uVar20 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar21);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar24 = (char *)*ppvVar13;
    }
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if (plVar11[0xb] == 0) {
      pcVar24 = (*Curl_cstrdup)(pcVar24);
      plVar11[0xb] = (long)pcVar24;
      CVar25 = CURL_FORMADD_MEMORY;
      if (pcVar24 != (char *)0x0) {
        *(undefined1 *)(plVar11 + 0xc) = 1;
        CVar25 = CURL_FORMADD_OK;
      }
    }
    goto switchD_00514e61_caseD_9;
  case 0xc:
    *(byte *)(plVar11 + 8) = *(byte *)(plVar11 + 8) | 0x30;
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if (plVar11[9] != 0) goto switchD_00514e61_caseD_9;
    if (!bVar6) {
      uVar21 = (ulong)uVar20;
      if (uVar21 < 0x29) {
        uVar20 = uVar20 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar21);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar24 = (char *)*ppvVar13;
    }
    CVar25 = CURL_FORMADD_NULL;
    if (pcVar24 == (char *)0x0) goto switchD_00514e61_caseD_9;
    plVar11[9] = (long)pcVar24;
    break;
  case 0xd:
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if (plVar11[10] == 0) {
      if (!bVar6) {
        uVar21 = (ulong)uVar20;
        if (uVar21 < 0x29) {
          uVar20 = uVar20 + 8;
          ppvVar13 = (void **)((long)local_e8 + uVar21);
        }
        else {
          ppvVar13 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar24 = (char *)*ppvVar13;
      }
      plVar11[10] = (long)pcVar24;
      CVar25 = CURL_FORMADD_OK;
    }
    goto switchD_00514e61_caseD_9;
  case 0xe:
    goto switchD_00514e61_caseD_e;
  case 0xf:
    if (!bVar6) {
      uVar21 = (ulong)uVar20;
      if (uVar21 < 0x29) {
        uVar20 = uVar20 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar21);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar24 = (char *)*ppvVar13;
    }
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if (plVar11[0xe] == 0) {
      plVar11[0xe] = (long)pcVar24;
      CVar25 = CURL_FORMADD_OK;
    }
    goto switchD_00514e61_caseD_9;
  case 0x13:
    *(byte *)(plVar11 + 8) = *(byte *)(plVar11 + 8) | 0x40;
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if (plVar11[0xd] != 0) goto switchD_00514e61_caseD_9;
    if (!bVar6) {
      uVar21 = (ulong)uVar20;
      if (uVar21 < 0x29) {
        uVar20 = uVar20 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar21);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar24 = (char *)*ppvVar13;
    }
    CVar25 = CURL_FORMADD_NULL;
    if (pcVar24 == (char *)0x0) goto switchD_00514e61_caseD_9;
    plVar11[0xd] = (long)pcVar24;
    break;
  case 0x14:
    *(byte *)(plVar11 + 8) = *(byte *)(plVar11 + 8) | 0x80;
switchD_00514e61_caseD_6:
    if (!bVar6) {
      uVar21 = (ulong)uVar20;
      if (uVar21 < 0x29) {
        uVar20 = uVar20 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar21);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar24 = (char *)*ppvVar13;
    }
    plVar11[5] = (long)pcVar24;
    CVar25 = CURL_FORMADD_OK;
    goto switchD_00514e61_caseD_9;
  }
  plVar11[3] = (long)pcVar24;
  CVar25 = CURL_FORMADD_OK;
  goto switchD_00514e61_caseD_9;
switchD_00514e61_caseD_e:
  if (!bVar6) {
    uVar21 = (ulong)uVar20;
    if (uVar21 < 0x29) {
      uVar20 = uVar20 + 8;
      ppvVar13 = (void **)((long)local_e8 + uVar21);
    }
    else {
      ppvVar13 = local_160;
      local_160 = local_160 + 1;
    }
    pcVar24 = (char *)*ppvVar13;
  }
  if (plVar11[6] == 0) {
    CVar25 = CURL_FORMADD_NULL;
    if (pcVar24 != (char *)0x0) {
      pcVar24 = (*Curl_cstrdup)(pcVar24);
      plVar11[6] = (long)pcVar24;
      CVar25 = CURL_FORMADD_MEMORY;
      if (pcVar24 != (char *)0x0) {
        *(undefined1 *)(plVar11 + 7) = 1;
        CVar25 = CURL_FORMADD_OK;
      }
    }
  }
  else {
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if (((*(byte *)(plVar11 + 8) & 1) != 0) && (CVar25 = CURL_FORMADD_NULL, pcVar24 != (char *)0x0))
    {
      local_150 = (*Curl_cstrdup)(pcVar24);
      CVar25 = CURL_FORMADD_MEMORY;
      if (local_150 != (char *)0x0) {
        plVar12 = (long *)(*Curl_ccalloc)(1,0x80);
        if (plVar12 == (long *)0x0) {
          plVar12 = (long *)0x0;
        }
        else {
          plVar12[6] = (long)local_150;
          plVar12[8] = 1;
          plVar12[0xf] = plVar11[0xf];
          plVar11[0xf] = (long)plVar12;
        }
        if (plVar12 != (long *)0x0) {
          *(undefined1 *)(plVar12 + 7) = 1;
          plVar11 = plVar12;
          goto LAB_00514de5;
        }
LAB_0051550c:
        CVar25 = CURL_FORMADD_MEMORY;
        (*Curl_cfree)(local_150);
      }
    }
  }
  goto switchD_00514e61_caseD_9;
LAB_0051553d:
  do {
    if ((char)plVar12[1] == '\x01') {
      (*Curl_cfree)((void *)*plVar12);
      *plVar12 = 0;
      *(undefined1 *)(plVar12 + 1) = 0;
    }
    if ((char)plVar12[4] == '\x01') {
      (*Curl_cfree)((void *)plVar12[3]);
      plVar12[3] = 0;
      *(undefined1 *)(plVar12 + 4) = 0;
    }
    if ((char)plVar12[7] == '\x01') {
      (*Curl_cfree)((void *)plVar12[6]);
      plVar12[6] = 0;
      *(undefined1 *)(plVar12 + 7) = 0;
    }
    if ((char)plVar12[0xc] == '\x01') {
      (*Curl_cfree)((void *)plVar12[0xb]);
      plVar12[0xb] = 0;
      *(undefined1 *)(plVar12 + 0xc) = 0;
    }
    plVar11 = plVar12 + 0xf;
    plVar12 = (long *)*plVar11;
  } while ((long *)*plVar11 != (long *)0x0);
  if (CVar25 == CURL_FORMADD_OK) {
LAB_005155b1:
    CVar25 = CURL_FORMADD_OK;
    local_150 = (char *)0x0;
    plVar11 = plVar10;
    pcVar19 = (curl_httppost *)0x0;
    do {
      p_Var7 = Curl_cstrdup;
      if (*plVar11 == 0) {
        if (pcVar19 != (curl_httppost *)0x0) goto LAB_005155e5;
LAB_005158f5:
        CVar25 = CURL_FORMADD_INCOMPLETE;
        break;
      }
      if (plVar11[3] == 0 && pcVar19 == (curl_httppost *)0x0) goto LAB_005158f5;
LAB_005155e5:
      if ((plVar11[5] != 0) && ((*(byte *)(plVar11 + 8) & 1) != 0)) goto LAB_005158f5;
      uVar20 = (uint)plVar11[8];
      if (((~uVar20 & 9) == 0) ||
         (((~uVar20 & 10) == 0 || ((~uVar20 & 0x30) == 0 && plVar11[9] == 0)))) goto LAB_005158f5;
      if (((plVar11[8] & 0x11U) != 0) && (plVar11[6] == 0)) {
        pcVar16 = *(char **)((long)plVar11 + (ulong)(uVar20 & 0x10) * 4 + 0x18);
        pcVar24 = local_150;
        if (local_150 == (char *)0x0) {
          pcVar24 = "application/octet-stream";
        }
        if (pcVar16 != (char *)0x0) {
          lVar26 = 8;
          do {
            sVar14 = strlen(pcVar16);
            pcVar1 = *(char **)((long)&Curl_handler_file.protocol + lVar26);
            sVar15 = strlen(pcVar1);
            if ((sVar15 <= sVar14) &&
               (iVar9 = Curl_strcasecompare(pcVar16 + (sVar14 - sVar15),pcVar1), iVar9 != 0)) {
              pcVar24 = *(char **)((long)&ContentTypeForFilename_ctts + lVar26);
              break;
            }
            lVar26 = lVar26 + 0x10;
          } while (lVar26 != 0x68);
        }
        pcVar16 = (*p_Var7)(pcVar24);
        plVar11[6] = (long)pcVar16;
        if (pcVar16 == (char *)0x0) {
          CVar25 = CURL_FORMADD_MEMORY;
          break;
        }
        *(undefined1 *)(plVar11 + 7) = 1;
      }
      if ((plVar11 == plVar10) && ((plVar11[8] & 4U) == 0)) {
        pcVar16 = (char *)*plVar11;
        if (pcVar16 != (char *)0x0) {
          sVar23 = plVar11[2];
          if (sVar23 == 0) {
            sVar14 = strlen(pcVar16);
            sVar23 = sVar14 + 1;
          }
          pvVar17 = Curl_memdup(pcVar16,sVar23);
          *plVar11 = (long)pvVar17;
        }
        if (*plVar11 != 0) {
          *(undefined1 *)(plVar11 + 1) = 1;
          goto LAB_0051574d;
        }
LAB_005158fd:
        CVar25 = CURL_FORMADD_MEMORY;
        break;
      }
LAB_0051574d:
      if (((*(byte *)(plVar11 + 8) & 0x6b) == 0) &&
         (pcVar16 = (char *)plVar11[3], pcVar16 != (char *)0x0)) {
        sVar23 = plVar11[5];
        if (sVar23 == 0) {
          sVar14 = strlen(pcVar16);
          sVar23 = sVar14 + 1;
        }
        pvVar17 = Curl_memdup(pcVar16,sVar23);
        plVar11[3] = (long)pvVar17;
        if (pvVar17 == (void *)0x0) {
          CVar25 = CURL_FORMADD_MEMORY;
          break;
        }
        *(undefined1 *)(plVar11 + 4) = 1;
      }
      pcVar16 = (char *)*plVar11;
      sVar14 = plVar11[2];
      pcVar24 = (char *)plVar11[3];
      lVar26 = plVar11[5];
      pcVar1 = (char *)plVar11[9];
      lVar2 = plVar11[10];
      pcVar3 = (char *)plVar11[6];
      uVar21 = plVar11[8];
      pcVar4 = (curl_slist *)plVar11[0xe];
      pcVar5 = (char *)plVar11[0xb];
      pvVar17 = (void *)plVar11[0xd];
      pcVar18 = (curl_httppost *)(*Curl_ccalloc)(1,0x70);
      if (pcVar18 == (curl_httppost *)0x0) {
        pcVar18 = (curl_httppost *)0x0;
      }
      else {
        pcVar18->name = pcVar16;
        if (pcVar16 == (char *)0x0) {
          sVar14 = 0;
        }
        else if (sVar14 == 0) {
          sVar14 = strlen(pcVar16);
        }
        pcVar18->namelength = sVar14;
        pcVar18->contents = pcVar24;
        pcVar18->contentlen = lVar26;
        pcVar18->buffer = pcVar1;
        pcVar18->bufferlength = lVar2;
        pcVar18->contenttype = pcVar3;
        pcVar18->contentheader = pcVar4;
        pcVar18->showfilename = pcVar5;
        pcVar18->userp = pvVar17;
        pcVar18->flags = uVar21 | 0x80;
        if (pcVar19 == (curl_httppost *)0x0) {
          pcVar19 = *last_post;
          if (*last_post == (curl_httppost *)0x0) {
            pcVar19 = (curl_httppost *)httppost;
          }
          pcVar19->next = pcVar18;
          ppcVar22 = last_post;
        }
        else {
          pcVar18->more = pcVar19->more;
          ppcVar22 = &pcVar19->more;
        }
        *ppcVar22 = pcVar18;
      }
      if (pcVar18 == (curl_httppost *)0x0) goto LAB_005158fd;
      plVar12 = plVar11 + 6;
      plVar11 = (long *)plVar11[0xf];
      if ((char *)*plVar12 != (char *)0x0) {
        local_150 = (char *)*plVar12;
      }
      pcVar19 = pcVar18;
    } while (plVar11 != (long *)0x0);
    if (CVar25 == CURL_FORMADD_OK) {
      CVar25 = CURL_FORMADD_OK;
    }
    else {
      for (; plVar11 != (long *)0x0; plVar11 = (long *)plVar11[0xf]) {
        if ((char)plVar11[1] == '\x01') {
          (*Curl_cfree)((void *)*plVar11);
          *plVar11 = 0;
          *(undefined1 *)(plVar11 + 1) = 0;
        }
        if ((char)plVar11[4] == '\x01') {
          (*Curl_cfree)((void *)plVar11[3]);
          plVar11[3] = 0;
          *(undefined1 *)(plVar11 + 4) = 0;
        }
        if ((char)plVar11[7] == '\x01') {
          (*Curl_cfree)((void *)plVar11[6]);
          plVar11[6] = 0;
          *(undefined1 *)(plVar11 + 7) = 0;
        }
        if ((char)plVar11[0xc] == '\x01') {
          (*Curl_cfree)((void *)plVar11[0xb]);
          plVar11[0xb] = 0;
          *(undefined1 *)(plVar11 + 0xc) = 0;
        }
      }
    }
  }
  do {
    plVar11 = (long *)plVar10[0xf];
    (*Curl_cfree)(plVar10);
    plVar10 = plVar11;
  } while (plVar11 != (long *)0x0);
  return CVar25;
}

Assistant:

CURLFORMcode curl_formadd(struct curl_httppost **httppost,
                          struct curl_httppost **last_post,
                          ...)
{
  va_list arg;
  CURLFORMcode result;
  va_start(arg, last_post);
  result = FormAdd(httppost, last_post, arg);
  va_end(arg);
  return result;
}